

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeBlockReturn
          (SimplifyLocals<true,_true,_true> *this,Block *block)

{
  map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
  *this_00;
  pointer *pppBVar1;
  Expression **ppEVar2;
  size_t sVar3;
  undefined8 *puVar4;
  Break *this_01;
  iterator __position;
  pointer ppLVar5;
  SimplifyLocals<true,_true,_true> *pSVar6;
  bool bVar7;
  Nop *output;
  const_iterator cVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  Block *pBVar11;
  mapped_type *pmVar12;
  Type type_;
  Expression *pEVar13;
  Drop *this_02;
  LocalSet *pLVar14;
  char *__function;
  ulong uVar15;
  Nop *output_1;
  long lVar16;
  undefined1 auVar17 [8];
  char cVar18;
  bool bVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
  pVar20;
  optional<wasm::Type> type__00;
  undefined1 local_390 [8];
  EffectAnalyzer value;
  EffectAnalyzer condition;
  Nop nop;
  undefined1 local_90 [8];
  FindAll<wasm::LocalSet> findAll;
  vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  local_68;
  Block *local_50;
  Block *block_local;
  SimplifyLocals<true,_true,_true> *local_40;
  key_type local_38;
  bool local_31;
  Index sharedIndex;
  
  if (((block->name).super_IString.str._M_str != (char *)0x0) &&
     (local_50 = block,
     cVar8 = std::
             _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             ::find(&(this->unoptimizableBlocks)._M_t,&block->name),
     (_Rb_tree_header *)cVar8._M_node ==
     &(this->unoptimizableBlocks)._M_t._M_impl.super__Rb_tree_header)) {
    this_00 = &this->blockBreaks;
    local_40 = this;
    pmVar9 = std::
             map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
             ::operator[](this_00,&local_50->name);
    local_68.
    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pmVar9->
         super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_68.
    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pmVar9->
         super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pmVar9->
         super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pmVar9->
    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pmVar9->
    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pmVar9->
    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVar20 = std::
             _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
             ::equal_range(&this_00->_M_t,&local_50->name);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar20.first._M_node,(_Base_ptr)pVar20.second._M_node);
    if (local_68.
        super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if ((*(local_68.
             super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
             ._M_impl.super__Vector_impl_data._M_start)->brp)->_id != BreakId) {
LAB_00b1a31a:
        __function = "T *wasm::Expression::cast() [T = wasm::Break]";
LAB_00b1a346:
        __assert_fail("int(_id) == int(T::SpecificId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                      ,0x31b,__function);
      }
      if (*(long *)(*(local_68.
                      super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                      ._M_impl.super__Vector_impl_data._M_start)->brp + 2) != 0) {
        __assert_fail("!(*breaks[0].brp)->template cast<Break>()->value",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x205,
                      "void wasm::SimplifyLocals<>::optimizeBlockReturn(Block *) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
      local_38 = 0xffffffff;
      pBVar11 = (Block *)(local_40->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      block_local = (Block *)&(local_40->sinkables)._M_t._M_impl.super__Rb_tree_header;
      if (pBVar11 != block_local) {
        findAll.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)&local_40->sinkables;
        bVar7 = false;
        do {
          bVar19 = local_68.
                   super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   local_68.
                   super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (bVar19) {
            lVar16 = 8;
            uVar15 = 0;
            do {
              sVar10 = std::
                       map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                       ::count((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                                *)((long)&(local_68.
                                           super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->brp + lVar16)
                               ,(key_type *)&pBVar11->list);
              if (sVar10 == 0) goto LAB_00b19e29;
              uVar15 = uVar15 + 1;
              lVar16 = lVar16 + 0x38;
              bVar19 = uVar15 < (ulong)(((long)local_68.
                                               super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_68.
                                               super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       0x6db6db6db6db6db7);
            } while (bVar19);
          }
          local_38 = *(key_type *)
                      &(pBVar11->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       data;
          bVar7 = true;
LAB_00b19e29:
        } while ((bVar19) &&
                (pBVar11 = (Block *)std::_Rb_tree_increment((_Rb_tree_node_base *)pBVar11),
                pBVar11 != block_local));
        if (bVar7) {
          local_31 = local_68.
                     super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                     ._M_impl.super__Vector_impl_data._M_finish !=
                     local_68.
                     super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (local_31) {
            uVar15 = 0;
            do {
              pmVar12 = std::
                        map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                        ::at(&local_68.
                              super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15].sinkables,&local_38)
              ;
              block_local = (Block *)*local_68.
                                      super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar15].brp;
              if ((block_local->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                  _id != BreakId) goto LAB_00b1a31a;
              ppEVar2 = pmVar12->item;
              pLVar14 = (LocalSet *)*ppEVar2;
              if ((pLVar14->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                  != LocalSetId) goto LAB_00b1a331;
              pEVar13 = (Expression *)
                        (block_local->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements;
              if (pEVar13 != (Expression *)0x0) {
                FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)local_90,pEVar13);
                ppLVar5 = findAll.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                auVar17 = local_90;
                if (local_90 ==
                    (undefined1  [8])
                    findAll.list.
                    super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  bVar7 = true;
                }
                else {
                  do {
                    pSVar6 = local_40;
                    cVar18 = '\0';
                    if (*(LocalSet **)auVar17 == pLVar14) {
                      condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count.
                      _0_1_ = 0x16;
                      *ppEVar2 = (Expression *)
                                 &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count;
                      EffectAnalyzer::EffectAnalyzer
                                ((EffectAnalyzer *)
                                 &value.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count,
                                 &((local_40->
                                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                   ).super_Pass.runner)->options,
                                 (local_40->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .currModule,
                                 (Expression *)
                                 (block_local->list).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 .usedElements);
                      EffectAnalyzer::EffectAnalyzer
                                ((EffectAnalyzer *)local_390,
                                 &((pSVar6->
                                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                   ).super_Pass.runner)->options,
                                 (pSVar6->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .currModule,(Expression *)pLVar14);
                      *ppEVar2 = (Expression *)pLVar14;
                      bVar7 = EffectAnalyzer::invalidates
                                        ((EffectAnalyzer *)
                                         &value.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(EffectAnalyzer *)local_390);
                      cVar18 = !bVar7 * '\t' + '\x01';
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&value.breakTargets._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&value.danglingPop);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&value.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&value.localsWritten._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&value.localsRead._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&value.features);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&condition.breakTargets._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&condition.danglingPop);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&condition.mutableGlobalsRead._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&condition.localsWritten._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&condition.localsRead._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&condition.features);
                    }
                    if (cVar18 != '\0') goto LAB_00b1a061;
                    auVar17 = (undefined1  [8])((long)auVar17 + 8);
                  } while (auVar17 != (undefined1  [8])ppLVar5);
                  cVar18 = '\n';
LAB_00b1a061:
                  bVar7 = cVar18 == '\n';
                }
                if (local_90 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_90,
                                  (long)findAll.list.
                                        super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_90)
                  ;
                }
                if (!bVar7) {
                  if ((local_31 & 1U) != 0) goto LAB_00b1a2ff;
                  break;
                }
              }
              uVar15 = uVar15 + 1;
              local_31 = uVar15 < (ulong)(((long)local_68.
                                                 super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_68.
                                                 super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                         0x6db6db6db6db6db7);
            } while (local_31);
          }
          sVar3 = (local_50->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements;
          if ((sVar3 == 0) ||
             ((local_50->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
              [sVar3 - 1]->_id != NopId)) {
            __position._M_current =
                 (local_40->blocksToEnlarge).
                 super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_40->blocksToEnlarge).
                super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<wasm::Block*,std::allocator<wasm::Block*>>::
              _M_realloc_insert<wasm::Block*const&>
                        ((vector<wasm::Block*,std::allocator<wasm::Block*>> *)
                         &local_40->blocksToEnlarge,__position,&local_50);
            }
            else {
              *__position._M_current = local_50;
              pppBVar1 = &(local_40->blocksToEnlarge).
                          super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppBVar1 = *pppBVar1 + 1;
            }
          }
          else {
            pmVar12 = std::
                      map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                      ::at((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                            *)findAll.list.
                              super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_38);
            ppEVar2 = pmVar12->item;
            pEVar13 = *ppEVar2;
            if (pEVar13->_id != LocalSetId) {
LAB_00b1a331:
              __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
              goto LAB_00b1a346;
            }
            sVar3 = (local_50->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                    usedElements;
            if (sVar3 == 0) {
              __assert_fail("index < usedElements",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                            ,0xbc,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            (local_50->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
            [sVar3 - 1] = (Expression *)pEVar13[1].type.id;
            pEVar13 = *ppEVar2;
            pEVar13->_id = NopId;
            (pEVar13->type).id = 0;
            if (local_68.
                super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_68.
                super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              lVar16 = 8;
              pBVar11 = (Block *)0x0;
              do {
                pmVar12 = std::
                          map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                          ::at((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                                *)((long)&(local_68.
                                           super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->brp + lVar16)
                               ,&local_38);
                puVar4 = *(undefined8 **)
                          ((long)local_68.
                                 super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8);
                this_01 = (Break *)*puVar4;
                if ((this_01->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.
                    _id != BreakId) goto LAB_00b1a31a;
                block_local = pBVar11;
                if (this_01->value != (Expression *)0x0) {
                  __assert_fail("!br->value",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                                ,0x25d,
                                "void wasm::SimplifyLocals<>::optimizeBlockReturn(Block *) [allowTee = true, allowStructure = true, allowNesting = true]"
                               );
                }
                ppEVar2 = pmVar12->item;
                pLVar14 = (LocalSet *)*ppEVar2;
                if ((pLVar14->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                    _id != LocalSetId) goto LAB_00b1a331;
                if (this_01->condition == (Expression *)0x0) {
                  this_01->value = pLVar14->value;
                  (pLVar14->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                       = NopId;
                  (pLVar14->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type
                  .id = 0;
                }
                else {
                  this_01->value = (Expression *)pLVar14;
                  type_ = Function::getLocalType
                                    ((local_40->
                                     super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                     ).
                                     super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                     .
                                     super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                     .
                                     super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                     .currFunction,pLVar14->index);
                  LocalSet::makeTee(pLVar14,type_);
                  pEVar13 = (Expression *)
                            MixedArena::allocSpace
                                      (&((local_40->
                                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                         ).
                                         super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                         .
                                         super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                         .
                                         super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                        .currModule)->allocator,0x10,8);
                  pEVar13->_id = NopId;
                  (pEVar13->type).id = 0;
                  *ppEVar2 = pEVar13;
                  Break::finalize(this_01);
                  this_02 = (Drop *)MixedArena::allocSpace
                                              (&((local_40->
                                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                                 ).
                                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                                 .
                                                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                                 .
                                                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                                .currModule)->allocator,0x18,8);
                  (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id
                       = DropId;
                  (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.
                  type.id = 0;
                  this_02->value = (Expression *)this_01;
                  Drop::finalize(this_02);
                  *puVar4 = this_02;
                }
                pBVar11 = (Block *)&(block_local->super_SpecificExpression<(wasm::Expression::Id)1>)
                                    .super_Expression.field_0x1;
                lVar16 = lVar16 + 0x38;
              } while (pBVar11 < (undefined1 *)
                                 (((long)local_68.
                                         super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68.
                                         super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x6db6db6db6db6db7));
            }
            pSVar6 = local_40;
            value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)(local_40->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                         .
                         super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                         .
                         super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                         .currModule;
            pLVar14 = Builder::makeLocalSet
                                ((Builder *)
                                 &value.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count,local_38,(Expression *)local_50);
            Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
            ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              *)&(pSVar6->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                             ,(Expression *)pLVar14);
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
            ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                     *)findAll.list.
                       super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
            local_40->anotherCycle = true;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)pLVar14;
            Block::finalize(local_50,type__00,Unknown);
          }
        }
      }
    }
LAB_00b1a2ff:
    std::
    vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
    ::~vector(&local_68);
  }
  return;
}

Assistant:

void optimizeBlockReturn(Block* block) {
    if (!block->name.is() || unoptimizableBlocks.count(block->name) > 0) {
      return;
    }
    auto breaks = std::move(blockBreaks[block->name]);
    blockBreaks.erase(block->name);
    if (breaks.size() == 0) {
      // block has no branches TODO we might optimize trivial stuff here too
      return;
    }
    // block does not already have a return value (if one break has one, they
    // all do)
    assert(!(*breaks[0].brp)->template cast<Break>()->value);
    // look for a local.set that is present in them all
    bool found = false;
    Index sharedIndex = -1;
    for (auto& [index, _] : sinkables) {
      bool inAll = true;
      for (size_t j = 0; j < breaks.size(); j++) {
        if (breaks[j].sinkables.count(index) == 0) {
          inAll = false;
          break;
        }
      }
      if (inAll) {
        sharedIndex = index;
        found = true;
        break;
      }
    }
    if (!found) {
      return;
    }
    // If one of our brs is a br_if, then we will give it a value. since
    // the value executes before the condition, it is dangerous if we are
    // moving code out of the condition,
    //  (br_if
    //   (block
    //    ..use $x..
    //    (local.set $x ..)
    //   )
    //  )
    // =>
    //  (br_if
    //   (local.tee $x ..) ;; this now affects the use!
    //   (block
    //    ..use $x..
    //   )
    //  )
    // so we must check for that.
    for (size_t j = 0; j < breaks.size(); j++) {
      // move break local.set's value to the break
      auto* breakLocalSetPointer = breaks[j].sinkables.at(sharedIndex).item;
      auto* brp = breaks[j].brp;
      auto* br = (*brp)->template cast<Break>();
      auto* set = (*breakLocalSetPointer)->template cast<LocalSet>();
      if (br->condition) {
        // TODO: optimize
        FindAll<LocalSet> findAll(br->condition);
        for (auto* otherSet : findAll.list) {
          if (otherSet == set) {
            // the set is indeed in the condition, so we can't just move it
            // but maybe there are no effects? see if, ignoring the set
            // itself, there is any risk
            Nop nop;
            *breakLocalSetPointer = &nop;
            EffectAnalyzer condition(
              this->getPassOptions(), *this->getModule(), br->condition);
            EffectAnalyzer value(
              this->getPassOptions(), *this->getModule(), set);
            *breakLocalSetPointer = set;
            if (condition.invalidates(value)) {
              // indeed, we can't do this, stop
              return;
            }
            break; // we found set in the list, can stop now
          }
        }
      }
    }
    // Great, this local is set in them all, we can optimize!
    if (block->list.size() == 0 || !block->list.back()->is<Nop>()) {
      // We can't do this here, since we can't push to the block -
      // it would invalidate sinkable pointers. So we queue a request
      // to grow the block at the end of the turn, we'll get this next
      // cycle.
      blocksToEnlarge.push_back(block);
      return;
    }
    // move block local.set's value to the end, in return position, and nop the
    // set
    auto* blockLocalSetPointer = sinkables.at(sharedIndex).item;
    auto* value = (*blockLocalSetPointer)->template cast<LocalSet>()->value;
    block->list[block->list.size() - 1] = value;
    ExpressionManipulator::nop(*blockLocalSetPointer);
    for (size_t j = 0; j < breaks.size(); j++) {
      // move break local.set's value to the break
      auto* breakLocalSetPointer = breaks[j].sinkables.at(sharedIndex).item;
      auto* brp = breaks[j].brp;
      auto* br = (*brp)->template cast<Break>();
      assert(!br->value);
      // if the break is conditional, then we must set the value here - if the
      // break is not reached, we must still have the new value in the local
      auto* set = (*breakLocalSetPointer)->template cast<LocalSet>();
      if (br->condition) {
        br->value = set;
        set->makeTee(this->getFunction()->getLocalType(set->index));
        *breakLocalSetPointer =
          this->getModule()->allocator.template alloc<Nop>();
        // in addition, as this is a conditional br that now has a value, it now
        // returns a value, so it must be dropped
        br->finalize();
        *brp = Builder(*this->getModule()).makeDrop(br);
      } else {
        br->value = set->value;
        ExpressionManipulator::nop(set);
      }
    }
    // finally, create a local.set on the block itself
    auto* newLocalSet =
      Builder(*this->getModule()).makeLocalSet(sharedIndex, block);
    this->replaceCurrent(newLocalSet);
    sinkables.clear();
    anotherCycle = true;
    block->finalize();
  }